

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar.c
# Opt level: O3

axbStatus_t
axbScalarCreate(axbHandle_s *handle,axbScalar_s **scalar,void *value,axbDataType_t datatype,
               axbMemBackend_s *mem)

{
  axbScalar_s *paVar1;
  
  axbScalarCreateBegin(handle,scalar);
  paVar1 = *scalar;
  paVar1->datatype = datatype;
  if (mem != (axbMemBackend_s *)0x0) {
    paVar1->memBackend = mem;
    paVar1 = *scalar;
  }
  (*paVar1->memBackend->op_malloc)(&paVar1->data,8,paVar1->memBackend->impl);
  paVar1 = *scalar;
  axbMemBackendCopyIn(paVar1->memBackend,value,datatype,paVar1->data,paVar1->datatype,1);
  return 0;
}

Assistant:

axbStatus_t axbScalarCreate(struct axbHandle_s *handle, struct axbScalar_s **scalar, void *value, axbDataType_t datatype, struct axbMemBackend_s *mem)
{
  axbScalarCreateBegin(handle, scalar);
  axbScalarSetDataType(*scalar, datatype);
  axbScalarSetMemBackend(*scalar, mem);
  axbScalarCreateEnd(*scalar);
  axbScalarSetValue(*scalar, value, datatype);
  return 0;
}